

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  allocator<unsigned_int> *this_00;
  GLuint GVar1;
  GLenum GVar2;
  reference pvVar3;
  CallLogWrapper *this_01;
  DILogger local_550;
  DILogger local_3d0;
  ulong local_250;
  size_t i;
  int offsets [3];
  DIResult result;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zarro;
  allocator<char> local_59;
  string local_58;
  string local_38;
  CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3> *local_18;
  CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  local_18 = this;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_38,&local_58,
                     (string *)
                     &zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar1;
  std::__cxx11::string::~string
            ((string *)
             &zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->_program == 0) {
    this_local = (CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3> *)
                 &DAT_ffffffffffffffff;
  }
  else {
    this_01 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_01,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_01,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_01,this->_vao);
    result.status_._4_4_ = 0;
    this_00 = (allocator<unsigned_int> *)((long)&result.status_ + 3);
    std::allocator<unsigned_int>::allocator(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0x1000,
               (value_type_conflict4 *)((long)&result.status_ + 4),this_00);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&result.status_ + 3))
    ;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0x1000,pvVar3,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x1000,pvVar3,0x88e4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->_ebo);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,0x1000,pvVar3,0x88e4);
    DIResult::DIResult((DIResult *)(offsets + 1));
    stack0xfffffffffffffdbc = 0x300000001;
    offsets[0] = 0x3ff;
    for (local_250 = 0; local_250 < 3; local_250 = local_250 + 1) {
      glu::CallLogWrapper::glDrawElementsIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,0x1405,(void *)(long)*(int *)((long)&i + local_250 * 4 + 4)
                );
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x501) {
        DIResult::error(&local_3d0,(DIResult *)(offsets + 1));
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_3d0,
                   (char (*) [66])
                   "Invalid error code returned by a driver for GL_INVALID_VALUE type");
        DILogger::~DILogger(&local_3d0);
      }
      glu::CallLogWrapper::glDrawArraysIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,(void *)(long)*(int *)((long)&i + local_250 * 4 + 4));
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x501) {
        DIResult::error(&local_550,(DIResult *)(offsets + 1));
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_550,
                   (char (*) [66])
                   "Invalid error code returned by a driver for GL_INVALID_VALUE type");
        DILogger::~DILogger(&local_550);
      }
    }
    this_local = (CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::ES3> *)
                 DIResult::code((DIResult *)(offsets + 1));
    DIResult::~DIResult((DIResult *)(offsets + 1));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		std::vector<GLuint> zarro(4096, 0);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);
		glBufferData(GL_ARRAY_BUFFER, 4096, &zarro[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		DIResult result;

		int offsets[] = { 1, 3, 1023 };
		for (size_t i = 0; i < sizeof(offsets) / sizeof(offsets[0]); i++)
		{
			glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, reinterpret_cast<void*>((deUintptr)offsets[i]));
			if (glGetError() != GL_INVALID_VALUE)
			{
				result.error() << "Invalid error code returned by a driver for GL_INVALID_VALUE type";
			}
			glDrawArraysIndirect(GL_TRIANGLES, reinterpret_cast<void*>((deUintptr)offsets[i]));
			if (glGetError() != GL_INVALID_VALUE)
			{
				result.error() << "Invalid error code returned by a driver for GL_INVALID_VALUE type";
			}
		}

		return result.code();
	}